

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O3

bool __thiscall
chrono::geometry::ChTriangleMeshConnected::SplitEdge
          (ChTriangleMeshConnected *this,int itA,int itB,int neA,int neB,int *itA_1,int *itA_2,
          int *itB_1,int *itB_2,
          vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *tri_map,
          vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
          *aux_data_double,
          vector<std::vector<int,_std::allocator<int>_>_*,_std::allocator<std::vector<int,_std::allocator<int>_>_*>_>
          *aux_data_int,
          vector<std::vector<bool,_std::allocator<bool>_>_*,_std::allocator<std::vector<bool,_std::allocator<bool>_>_*>_>
          *aux_data_bool,
          vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
          *aux_data_vect)

{
  uint *puVar1;
  pointer *ppaVar2;
  undefined4 uVar3;
  pointer paVar4;
  iterator iVar5;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *pvVar6;
  vector<double,std::allocator<double>> *this_00;
  iterator __position;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *this_01;
  pointer pCVar7;
  vector<int,std::allocator<int>> *this_02;
  iterator __position_00;
  undefined8 *puVar8;
  vector<bool,_std::allocator<bool>_> *this_03;
  int *piVar9;
  ChTriangleMeshConnected *pCVar10;
  bool bVar11;
  double dVar12;
  uint uVar13;
  pair<int,_int> pVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
  *pvVar21;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 uVar22;
  undefined1 extraout_AL_01;
  undefined1 extraout_AL_02;
  int in;
  int iVar23;
  pair<int,_int> pVar24;
  ulong uVar25;
  pair<int,_int> pVar26;
  pointer paVar27;
  int *piVar28;
  list<int,std::allocator<int>> *plVar29;
  _List_node_base *p_Var30;
  long lVar31;
  ChTriangleMeshConnected *pCVar32;
  vector<int,_std::allocator<int>_> *pvVar33;
  ChException *this_04;
  uint uVar34;
  int iVar35;
  undefined4 in_register_0000000c;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *__x;
  long lVar36;
  pair<int,_int> pVar37;
  ChTriangleMeshConnected *extraout_RDX;
  int iVar38;
  pair<int,_int> unaff_RBX;
  pointer piVar39;
  uint uVar40;
  int iVar41;
  char *this_05;
  ChGeometry this_06;
  undefined4 in_register_00000084;
  vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
  *pvVar42;
  ulong uVar43;
  pair<int,_int> pVar44;
  undefined8 *puVar45;
  pair<int,_int> this_07;
  uint i2;
  pair<int,_int> pVar46;
  ulong uVar47;
  pair<int,_int> pVar48;
  bool bVar49;
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  reference rVar62;
  int iVnew;
  array<int,_4UL> topo_A_2;
  array<int,_4UL> topo_B_2;
  array<int,_4UL> topo_B_1;
  int iStack_2c8;
  int iStack_2c4;
  vector<int,_std::allocator<int>_> vStack_2c0;
  undefined1 auStack_2a8 [48];
  list<int,std::allocator<int>> *plStack_278;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> vStack_260;
  pointer pCStack_240;
  pointer pCStack_238;
  vector<bool,_std::allocator<bool>_> vStack_230;
  vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
  *pvStack_208;
  pair<int,_int> pStack_200;
  pointer pCStack_1f8;
  pair<int,_int> pStack_1f0;
  list<int,std::allocator<int>> *plStack_1e8;
  pointer piStack_1e0;
  string sStack_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1b8;
  pair<int,_int> pStack_1a8;
  pair<int,_int> pStack_1a0;
  pair<int,_int> pStack_198;
  code *pcStack_190;
  uint local_184;
  uint local_180;
  uint local_17c;
  value_type local_178;
  uint local_158;
  uint local_154;
  uint *local_150;
  value_type local_144;
  pair<int,_int> local_138;
  pair<int,_int> local_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  array<int,_4UL> local_118;
  undefined1 local_108 [24];
  pair<int,_int> local_f0;
  pair<int,_int> local_e8;
  double dStack_e0;
  pointer local_d8;
  pointer paStack_d0;
  undefined1 local_c8 [16];
  long local_b0;
  long local_a8;
  vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
  *local_a0;
  undefined8 local_98;
  ulong local_90;
  pair<int,_int> local_88;
  pair<int,_int> local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_50 [32];
  undefined1 auVar51 [16];
  
  pvVar42 = (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
             *)CONCAT44(in_register_00000084,neB);
  pVar44.second = 0;
  pVar44.first = itB;
  uVar43 = (ulong)(uint)itA;
  pVar46 = (pair<int,_int>)(long)itA;
  local_98 = CONCAT44(in_register_0000000c,neA);
  auVar54 = vpbroadcastq_avx512vl();
  local_50 = vpaddq_avx2(auVar54,_DAT_009da6c0);
  pVar24.first = 0;
  pVar24.second = 0;
  local_150 = (uint *)itA_1;
  local_f0 = (pair<int,_int>)this;
  local_a0 = pvVar42;
  local_17c = 0;
  local_180 = 0;
  local_154 = itB;
  local_158 = itA;
  local_130 = pVar46;
  local_a8 = (long)(neA + 1);
  local_68 = vpbroadcastd_avx512vl();
  local_11c = neA + 3 + ((neA + 2) / 3) * -3;
  local_120 = neA + 2 + ((neA + 1) / 3) * -3;
  local_b0 = (long)(neB + 1);
  local_78 = vpbroadcastd_avx512vl();
  local_138 = (pair<int,_int>)(long)itB;
  local_124 = neB + 3 + ((neB + 2) / 3) * -3;
  local_128 = neB + 2 + ((neB + 1) / 3) * -3;
  do {
    this_07 = *(pair<int,_int> *)(local_50 + (long)pVar24 * 8);
    lVar36 = (long)*(pointer *)((long)this_07 + 8) - *(long *)this_07;
    if (lVar36 != 0) {
      __x = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
            0xaaaaaaaaaaaaaaab;
      pVar37 = (pair<int,_int>)((lVar36 >> 2) * -0x5555555555555555);
      pVar26 = pVar46;
      pvVar21 = (vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
                 *)CONCAT44(local_178.m_data[0]._4_4_,local_178.m_data[0]._0_4_);
      if ((ulong)pVar46 <= (ulong)pVar37 && (long)pVar37 - (long)pVar46 != 0) {
        pVar37 = (pair<int,_int>)((long)pVar46 * 3);
        pVar26.first = 0;
        pVar26.second = 0;
        pcStack_190 = (code *)0x80a86e;
        local_e8 = pVar24;
        pVar24 = GetTriangleEdgeIndexes
                           (this,(ChVector<int> *)(*(long *)this_07 + (long)pVar46 * 0xc),
                            (int)local_98,false);
        uVar25 = 0;
        if (local_154 == 0xffffffff) {
LAB_0080a8c6:
          pVar44 = local_e8;
          unaff_RBX = (pair<int,_int>)((ulong)pVar24 >> 0x20);
          local_c8._0_8_ = pVar37;
          pvVar42 = (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                     *)&local_184;
          iVar38 = pVar24.second;
          pVar46 = unaff_RBX;
          if (pVar24.first < iVar38) {
            pVar46 = pVar24;
          }
          uVar43 = (ulong)pVar46 & 0xffffffff;
          pVar14 = unaff_RBX;
          if (iVar38 < pVar24.first) {
            pVar14 = pVar24;
          }
          pVar37 = (pair<int,_int>)((ulong)pVar14 & 0xffffffff);
          pVar48.first = -1;
          pVar48.second = 0;
          local_184 = 0xffffffff;
          uVar40 = pVar46.first;
          i2 = pVar14.first;
          pcStack_190 = (code *)0x80a92a;
          local_90 = uVar25;
          local_88 = pVar26;
          local_80 = pVar24;
          InterpolateAndInsert
                    ((ChTriangleMeshConnected *)local_f0,local_e8.first,uVar40,i2,(int *)pvVar42);
          pVar24 = local_e8;
          *local_150 = 0xffffffff;
          *itA_2 = -1;
          pVar46.second = 0;
          pVar46.first = local_180;
          if (pVar44 == (pair<int,_int>)0x0) {
            pVar46 = pVar37;
          }
          uVar25 = (ulong)local_17c;
          if (pVar44 == (pair<int,_int>)0x0) {
            uVar25 = uVar43;
          }
          local_180 = pVar46.first;
          local_17c = (uint)uVar25;
          *itB_1 = -1;
          *itB_2 = -1;
          __x = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                0xaaaaaaaaaaaaaaab;
          lVar36 = *(long *)this_07;
          pVar46 = (pair<int,_int>)
                   (((long)*(pointer *)((long)this_07 + 8) - lVar36 >> 2) * -0x5555555555555555);
          pVar26 = local_130;
          if ((ulong)local_130 <= (ulong)pVar46 && (long)pVar46 - (long)local_130 != 0) {
            local_144.m_data[0] = *(uint *)(lVar36 + local_c8._0_8_ * 4);
            uVar25 = *(ulong *)(lVar36 + 4 + local_c8._0_8_ * 4);
            local_144.m_data[1] = *(uint *)(lVar36 + 4 + local_c8._0_8_ * 4);
            uVar13 = local_144.m_data[0];
            if (local_144.m_data[0] == uVar40) {
              uVar13 = local_184;
            }
            local_144.m_data[2] = *(uint *)(lVar36 + 8 + local_c8._0_8_ * 4);
            if (local_144.m_data[0] == i2) {
              local_144.m_data[0] = local_184;
            }
            if (local_144.m_data[1] == i2) {
              local_144.m_data[1] = local_184;
            }
            if (local_144.m_data[2] == i2) {
              local_144.m_data[2] = local_184;
            }
            puVar1 = (uint *)(lVar36 + local_c8._0_8_ * 4);
            local_c8 = vpbroadcastd_avx512vl();
            auVar50._8_8_ = 0;
            auVar50._0_8_ = uVar25;
            uVar47 = vpcmpeqd_avx512vl(auVar50,local_c8);
            auVar50 = vpbroadcastd_avx512vl();
            bVar49 = (bool)((byte)(uVar47 & 0xf) & 1);
            bVar11 = (bool)((byte)((uVar47 & 0xf) >> 1) & 1);
            *puVar1 = uVar13;
            *(ulong *)(puVar1 + 1) =
                 CONCAT44((uint)bVar11 * auVar50._4_4_ | (uint)!bVar11 * (int)(uVar25 >> 0x20),
                          (uint)bVar49 * auVar50._0_4_ | (uint)!bVar49 * (int)uVar25);
            *local_150 = local_158;
            pcStack_190 = (code *)0x80aa41;
            this = (ChTriangleMeshConnected *)this_07;
            itA_1 = (int *)this_07;
            std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::push_back
                      ((vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)
                       this_07,&local_144);
            uVar13 = local_154;
            lVar36 = *(long *)this_07;
            pVar44.second = 0;
            pVar44.first = local_154;
            pVar46 = (pair<int,_int>)
                     (((long)*(pointer *)((long)this_07 + 8) - lVar36 >> 2) * -0x5555555555555555);
            uVar34 = pVar46.first - 1;
            __x = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                  (ulong)uVar34;
            *itA_2 = uVar34;
            pvVar42 = (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                       *)itA_2;
            if (local_154 != 0xffffffff) {
              pVar26 = local_138;
              pVar48 = pVar24;
              if ((ulong)pVar46 < (ulong)local_138 || (long)pVar46 - (long)local_138 == 0)
              goto LAB_0080b049;
              local_178.m_data[0]._0_4_ = *(uint *)(lVar36 + (long)local_138 * 0xc);
              uVar43 = *(ulong *)(lVar36 + 4 + (long)local_138 * 0xc);
              local_178.m_data[0]._4_4_ = *(uint *)(lVar36 + 4 + (long)local_138 * 0xc);
              uVar34 = local_178.m_data[0]._0_4_;
              if (local_178.m_data[0]._0_4_ == uVar40) {
                uVar34 = local_184;
              }
              local_178.m_data[1]._0_4_ = *(uint *)(lVar36 + 8 + (long)local_138 * 0xc);
              if (local_178.m_data[0]._0_4_ == i2) {
                local_178.m_data[0]._0_4_ = local_184;
              }
              itA_1._4_4_ = 0;
              itA_1._0_4_ = local_178.m_data[0]._0_4_;
              if (local_178.m_data[0]._4_4_ == i2) {
                local_178.m_data[0]._4_4_ = local_184;
              }
              if (local_178.m_data[1]._0_4_ == i2) {
                local_178.m_data[1]._0_4_ = local_184;
              }
              auVar51._8_8_ = 0;
              auVar51._0_8_ = uVar43;
              uVar25 = vpcmpeqd_avx512vl(auVar51,local_c8);
              puVar1 = (uint *)(lVar36 + (long)local_138 * 0xc);
              *puVar1 = uVar34;
              auVar50 = vpbroadcastd_avx512vl();
              bVar49 = (bool)((byte)(uVar25 & 0xf) & 1);
              bVar11 = (bool)((byte)((uVar25 & 0xf) >> 1) & 1);
              *(ulong *)(puVar1 + 1) =
                   CONCAT44((uint)bVar11 * auVar50._4_4_ | (uint)!bVar11 * (int)(uVar43 >> 0x20),
                            (uint)bVar49 * auVar50._0_4_ | (uint)!bVar49 * (int)uVar43);
              *itB_1 = local_154;
              pcStack_190 = (code *)0x80ab17;
              this = (ChTriangleMeshConnected *)this_07;
              std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::push_back
                        ((vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)
                         this_07,(value_type *)&local_178);
              *itB_2 = (int)((ulong)((long)*(pointer *)((long)this_07 + 8) - *(long *)this_07) >> 2)
                       * -0x55555555 + -1;
              __x = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)itB_2;
            }
            lVar36 = local_a8;
            iVar23 = local_120;
            pVar46 = local_130;
            uVar40 = local_158;
            uVar43 = (ulong)local_158;
            if (pVar24 == (pair<int,_int>)0x0) {
              paVar4 = (tri_map->
                       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              iVar41 = local_80.first;
              uVar15 = *(undefined8 *)paVar4[(long)local_130]._M_elems;
              uVar16 = *(undefined8 *)(paVar4[(long)local_130]._M_elems + 2);
              local_178.m_data[0]._0_4_ = (uint)uVar15;
              local_178.m_data[0]._4_4_ = (uint)((ulong)uVar15 >> 0x20);
              local_178.m_data[1]._0_4_ = (uint)uVar16;
              local_178.m_data[1]._4_4_ = (undefined4)((ulong)uVar16 >> 0x20);
              uVar15 = *(undefined8 *)paVar4[(long)local_130]._M_elems;
              paVar27 = paVar4 + (long)local_130;
              local_118._M_elems[0] = (int)uVar15;
              local_118._M_elems[1] = (int)((ulong)uVar15 >> 0x20);
              local_118._M_elems._8_8_ = *(undefined8 *)(paVar4[(long)local_130]._M_elems + 2);
              *(int *)((long)local_178.m_data + local_a8 * 4) = *itB_1;
              local_118._M_elems[lVar36] = *itB_2;
              iVar35 = local_11c;
              if (iVar38 < iVar41) {
                iVar35 = iVar23;
                iVar23 = local_11c;
              }
              *(int *)((long)local_178.m_data + (long)iVar35 * 4) = *itA_2;
              local_118._M_elems[iVar23] = *local_150;
              auVar50 = vpbroadcastd_avx512vl();
              lVar36 = (long)*(int *)((long)local_178.m_data + (long)iVar23 * 4);
              iVar38 = local_118._M_elems[iVar35];
              this = (ChTriangleMeshConnected *)(lVar36 * 0x10);
              auVar51 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(paVar4[lVar36]._M_elems + 1));
              auVar52._0_12_ = auVar51._0_12_;
              auVar52._12_4_ = 0;
              vpcmpeqd_avx512vl(auVar52,local_68);
              auVar50 = vmovdqu32_avx512vl(auVar50);
              *(undefined1 (*) [16])(paVar4[lVar36]._M_elems + 1) = auVar50;
              lVar36 = 1;
              do {
                if (paVar4[iVar38]._M_elems[lVar36] == uVar40) {
                  paVar4[iVar38]._M_elems[lVar36] = *itA_2;
                }
                lVar36 = lVar36 + 1;
              } while (lVar36 != 4);
              auVar17._4_4_ = local_178.m_data[0]._4_4_;
              auVar17._0_4_ = local_178.m_data[0]._0_4_;
              auVar17._8_4_ = local_178.m_data[1]._0_4_;
              auVar17._12_4_ = local_178.m_data[1]._4_4_;
              *(undefined1 (*) [16])paVar27->_M_elems = auVar17;
              iVar5._M_current =
                   (tri_map->
                   super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar5._M_current ==
                  (tri_map->
                  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                pcStack_190 = (code *)0x80acaf;
                this = (ChTriangleMeshConnected *)tri_map;
                std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
                _M_realloc_insert<std::array<int,4ul>const&>
                          ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
                           tri_map,iVar5,&local_118);
                paVar27 = (tri_map->
                          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                auVar18._4_4_ = local_118._M_elems[1];
                auVar18._0_4_ = local_118._M_elems[0];
                auVar18._8_4_ = local_118._M_elems[2];
                auVar18._12_4_ = local_118._M_elems[3];
                *(undefined1 (*) [16])(iVar5._M_current)->_M_elems = auVar18;
                paVar27 = (tri_map->
                          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish + 1;
                (tri_map->
                super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
                _M_impl.super__Vector_impl_data._M_finish = paVar27;
              }
              lVar36 = local_b0;
              pvVar6 = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                       (tri_map->
                       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_118._M_elems[0] = (int)((ulong)((long)paVar27 - (long)pvVar6) >> 4) + -1;
              __x = pvVar6;
              unaff_RBX = (pair<int,_int>)itB_2;
              if (uVar13 != 0xffffffff) {
                iVar35 = local_88.first;
                iVar41 = (int)local_90;
                ppaVar2 = &(pvVar6->
                           super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + (long)local_138 * 2;
                local_d8 = *ppaVar2;
                paStack_d0 = ppaVar2[1];
                ppaVar2 = &(pvVar6->
                           super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + (long)local_138 * 2;
                local_108._0_8_ = *ppaVar2;
                local_108._8_8_ = ppaVar2[1];
                *(uint *)((long)&local_d8 + local_b0 * 4) = *local_150;
                *(int *)(local_108 + lVar36 * 4) = *itA_2;
                iVar38 = local_124;
                iVar23 = local_128;
                if (iVar41 < iVar35) {
                  iVar38 = local_128;
                  iVar23 = local_124;
                }
                *(int *)((long)&local_d8 + (long)iVar38 * 4) = *itB_2;
                this._4_4_ = 0;
                this._0_4_ = *itB_1;
                pvVar42 = (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                           *)((long)*(int *)((long)&local_d8 + (long)iVar23 * 4) * 0x10);
                *(int *)(local_108 + (long)iVar23 * 4) = *itB_1;
                auVar50 = vpbroadcastd_avx512vl();
                iVar38 = *(int *)(local_108 + (long)iVar38 * 4);
                auVar51 = vmovdqu32_avx512vl(*(undefined1 (*) [16])
                                              ((undefined1 *)
                                               ((long)&(pvVar6->
                                                  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 4) +
                                              (long)pvVar42));
                auVar53._0_12_ = auVar51._0_12_;
                auVar53._12_4_ = 0;
                vpcmpeqd_avx512vl(auVar53,local_78);
                auVar50 = vmovdqu32_avx512vl(auVar50);
                *(undefined1 (*) [16])
                 ((undefined1 *)
                  ((long)&(pvVar6->
                          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 4) + (long)pvVar42) = auVar50
                ;
                __x = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)0x1;
                do {
                  if (*(uint *)((long)&(pvVar6->
                                       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start +
                               (long)__x * 4 + (long)iVar38 * 0x10) == uVar13) {
                    *(int *)((long)&(pvVar6->
                                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start +
                            (long)__x * 4 + (long)iVar38 * 0x10) = *itB_2;
                  }
                  __x = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                        ((long)&(__x->
                                super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 1);
                } while (__x != (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                 *)&DAT_00000004);
                auVar20._8_8_ = paStack_d0;
                auVar20._0_8_ = local_d8;
                *(undefined1 (*) [16])
                 (&(pvVar6->
                   super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start + (long)local_138 * 2) = auVar20;
                iVar5._M_current =
                     (tri_map->
                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (tri_map->
                    super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  pcStack_190 = (code *)0x80ae15;
                  this = (ChTriangleMeshConnected *)tri_map;
                  std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
                  _M_realloc_insert<std::array<int,4ul>const&>
                            ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)
                             tri_map,iVar5,(array<int,_4UL> *)local_108);
                }
                else {
                  auVar19._8_8_ = local_108._8_8_;
                  auVar19._0_8_ = local_108._0_8_;
                  *(undefined1 (*) [16])(iVar5._M_current)->_M_elems = auVar19;
                  ppaVar2 = &(tri_map->
                             super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar2 = *ppaVar2 + 1;
                }
              }
            }
            goto LAB_0080ac90;
          }
        }
        else {
          __x = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                0xaaaaaaaaaaaaaaab;
          pVar46 = (pair<int,_int>)
                   (((long)*(pointer *)((long)this_07 + 8) - *(long *)this_07 >> 2) *
                   -0x5555555555555555);
          unaff_RBX = pVar26;
          pVar26 = local_138;
          pVar48 = pVar24;
          if ((ulong)local_138 <= (ulong)pVar46 && (long)pVar46 - (long)local_138 != 0) {
            pcStack_190 = (code *)0x80a8bf;
            pVar26 = GetTriangleEdgeIndexes
                               (this,(ChVector<int> *)(*(long *)this_07 + (long)local_138 * 0xc),
                                (int)local_a0,false);
            uVar25 = (ulong)pVar26 >> 0x20;
            goto LAB_0080a8c6;
          }
        }
LAB_0080b049:
        pVar46 = pVar37;
        pVar24 = pVar48;
        pvVar21 = (vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
                   *)CONCAT44(local_178.m_data[0]._4_4_,local_178.m_data[0]._0_4_);
      }
      goto LAB_0080b050;
    }
    __x = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)(ulong)local_180;
    pvVar42 = (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
               *)&local_178;
    pcStack_190 = (code *)0x80ac90;
    this = (ChTriangleMeshConnected *)local_f0;
    InterpolateAndInsert
              ((ChTriangleMeshConnected *)local_f0,pVar24.first,local_17c,local_180,(int *)pvVar42);
LAB_0080ac90:
    pVar24 = (pair<int,_int>)((long)pVar24 + 1);
  } while (pVar24 != (pair<int,_int>)0x4);
  pVar46 = (pair<int,_int>)(long)(int)local_17c;
  unaff_RBX = (pair<int,_int>)(long)(int)local_180;
  pVar44 = *(pair<int,_int> *)aux_data_double;
  this_07 = *(pair<int,_int> *)(aux_data_double + 8);
  if (pVar44 != this_07) {
    pVar24 = (pair<int,_int>)&local_178;
    do {
      this_00 = *(vector<double,std::allocator<double>> **)pVar44;
      __position._M_current = *(double **)(this_00 + 8);
      lVar36 = *(long *)this_00;
      pVar37 = (pair<int,_int>)((long)__position._M_current - lVar36 >> 3);
      pVar26 = pVar46;
      pvVar21 = (vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
                 *)local_178.m_data[0];
      if (((ulong)pVar37 <= (ulong)pVar46) ||
         (pVar26 = unaff_RBX, (ulong)pVar37 <= (ulong)unaff_RBX)) goto LAB_0080b050;
      local_178.m_data[0] =
           (*(double *)(lVar36 + (long)pVar46 * 8) + *(double *)(lVar36 + (long)unaff_RBX * 8)) *
           0.5;
      if (__position._M_current == *(double **)(this_00 + 0x10)) {
        pcStack_190 = (code *)0x80ae9d;
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (this_00,__position,(double *)pVar24);
      }
      else {
        *__position._M_current = local_178.m_data[0];
        *(double **)(this_00 + 8) = __position._M_current + 1;
      }
      pVar44 = (pair<int,_int>)((long)pVar44 + 8);
    } while (pVar44 != this_07);
  }
  pVar44 = *(pair<int,_int> *)aux_data_vect;
  this_07 = *(pair<int,_int> *)(aux_data_vect + 8);
  if (pVar44 != this_07) {
    uVar43 = (long)pVar46 * 3;
    pVar24 = (pair<int,_int>)((long)unaff_RBX * 3);
    local_e8.first = 0;
    local_e8.second = 0x3fe00000;
    dStack_e0 = 0.5;
    do {
      this_01 = *(vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> **)
                 pVar44;
      __x = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
            0xaaaaaaaaaaaaaaab;
      pCVar7 = (this_01->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pVar37 = (pair<int,_int>)
               (((long)(this_01->
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 3) *
               -0x5555555555555555);
      pVar26 = pVar46;
      pvVar21 = (vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
                 *)local_178.m_data[0];
      if (((ulong)pVar37 < (ulong)pVar46 || (long)pVar37 - (long)pVar46 == 0) ||
         (pVar26 = unaff_RBX,
         (ulong)pVar37 < (ulong)unaff_RBX || (long)pVar37 - (long)unaff_RBX == 0))
      goto LAB_0080b050;
      local_178.m_data[0] =
           (pCVar7[(long)pVar46].m_data[0] + pCVar7[(long)unaff_RBX].m_data[0]) * (double)local_e8;
      local_178.m_data[1] =
           (pCVar7[(long)pVar46].m_data[1] + pCVar7[(long)unaff_RBX].m_data[1]) * dStack_e0;
      local_178.m_data[2] =
           (pCVar7[(long)pVar46].m_data[2] + pCVar7[(long)unaff_RBX].m_data[2]) * 0.5;
      pcStack_190 = (code *)0x80af50;
      std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
                (this_01,&local_178);
      pVar44 = (pair<int,_int>)((long)pVar44 + 8);
    } while (pVar44 != this_07);
  }
  pVar44 = *(pair<int,_int> *)aux_data_int;
  this_07 = *(pair<int,_int> *)(aux_data_int + 8);
  if (pVar44 != this_07) {
    pVar24 = (pair<int,_int>)&local_178;
    pvVar21 = (vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
               *)local_178.m_data[0];
    do {
      local_178.m_data[0]._4_4_ = (uint)((ulong)pvVar21 >> 0x20);
      this_02 = *(vector<int,std::allocator<int>> **)pVar44;
      __position_00._M_current = *(int **)(this_02 + 8);
      lVar36 = *(long *)this_02;
      pVar37 = (pair<int,_int>)((long)__position_00._M_current - lVar36 >> 2);
      pVar26 = pVar46;
      if (((ulong)pVar37 <= (ulong)pVar46) ||
         (pVar26 = unaff_RBX, (ulong)pVar37 <= (ulong)unaff_RBX)) {
LAB_0080b050:
        this_05 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
        pcStack_190 = RefineMeshEdges;
        local_178.m_data[0] = (double)pvVar21;
        pCStack_240 = (pointer)std::__throw_out_of_range_fmt
                                         (
                                         "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                         );
        pvStack_208 = pvVar42;
        pStack_200 = (pair<int,_int>)itA_1;
        aStack_1b8._M_allocated_capacity = (size_type)unaff_RBX;
        aStack_1b8._8_8_ = pVar44;
        pStack_1a8 = this_07;
        pStack_1a0 = pVar46;
        pStack_198 = pVar24;
        pcStack_190 = (code *)uVar43;
        std::__cxx11::list<int,std::allocator<int>>::
        list<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((list<int,std::allocator<int>> *)&plStack_278,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   *(int **)pVar26,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   *(int **)((long)pVar26 + 8),(allocator_type *)&vStack_230);
        vStack_260.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_260.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_260.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (__x == (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)0x0) {
          ComputeNeighbouringTriangleMap((ChTriangleMeshConnected *)this_05,&vStack_260);
        }
        else {
          std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::operator=
                    (&vStack_260,__x);
        }
        vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        std::vector<bool,_std::allocator<bool>_>::resize
                  (&vStack_230,
                   ((long)(((ChTriangleMeshConnected *)this_05)->m_face_v_indices).
                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(((ChTriangleMeshConnected *)this_05)->m_face_v_indices).
                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
                   false);
        piVar9 = *(int **)((long)pVar26 + 8);
        for (piVar28 = *(int **)pVar26; piVar28 != piVar9; piVar28 = piVar28 + 1) {
          iVar38 = *piVar28;
          uVar43 = (ulong)iVar38;
          iVar23 = iVar38 + 0x3f;
          if (-1 < (long)uVar43) {
            iVar23 = iVar38;
          }
          *(ulong *)((int *)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                    (long)(iVar23 >> 6) * 2 +
                    (ulong)((uVar43 & 0x800000000000003f) < 0x8000000000000001) * 2 + -2) =
               *(ulong *)((int *)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         (long)(iVar23 >> 6) * 2 +
                         (ulong)((uVar43 & 0x800000000000003f) < 0x8000000000000001) * 2 + -2) |
               1L << (uVar43 & 0x3f);
        }
        vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (int *)0x0;
        vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        plVar29 = plStack_278;
        pStack_1f0 = pVar26;
        if (plStack_278 != (list<int,std::allocator<int>> *)&plStack_278) {
          do {
            auStack_2a8._0_8_ = auStack_2a8;
            uVar3 = *(undefined4 *)(plVar29 + 0x10);
            auStack_2a8._16_8_ = (pointer)0x0;
            auStack_2a8._8_8_ = auStack_2a8._0_8_;
            plStack_1e8 = plVar29;
            p_Var30 = (_List_node_base *)::operator_new(0x18);
            *(undefined4 *)&p_Var30[1]._M_next = uVar3;
            std::__detail::_List_node_base::_M_hook(p_Var30);
            auStack_2a8._16_8_ = (long)(double *)auStack_2a8._16_8_ + 1;
LAB_0080b1ef:
            if ((undefined1 *)auStack_2a8._0_8_ != auStack_2a8) {
              auVar57 = ZEXT864(0) << 0x40;
              auStack_2a8._28_4_ = 0;
              pCStack_238 = (pointer)0x0;
              auStack_2a8._40_8_ = (pointer)0x0;
              iVar38 = *(int *)&(((vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                   *)(auStack_2a8._8_8_ + 8))->
                                super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish;
              piVar39 = (pointer)(long)iVar38;
              this_06._vptr_ChGeometry = (_func_int **)auStack_2a8._0_8_;
              lVar36 = 0;
              do {
                pVar24 = GetTriangleEdgeIndexes
                                   ((ChTriangleMeshConnected *)this_06._vptr_ChGeometry,
                                    (((ChTriangleMeshConnected *)this_05)->m_face_v_indices).
                                    super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + (long)piVar39,
                                    (int)lVar36,true);
                iVar23 = pVar24.first;
                if (extraout_RDX == (ChTriangleMeshConnected *)0x0) {
                  pCVar7 = (((ChTriangleMeshConnected *)this_05)->m_vertices).
                           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  lVar31 = (long)pVar24 >> 0x20;
                  dVar12 = pCVar7[iVar23].m_data[1] - pCVar7[lVar31].m_data[1];
                  auVar55._8_8_ = 0;
                  auVar55._0_8_ = pCVar7[iVar23].m_data[0] - pCVar7[lVar31].m_data[0];
                  auVar58._8_8_ = 0;
                  auVar58._0_8_ = dVar12 * dVar12;
                  auVar50 = vfmadd231sd_fma(auVar58,auVar55,auVar55);
                  auVar60._8_8_ = 0;
                  auVar60._0_8_ = pCVar7[iVar23].m_data[2] - pCVar7[lVar31].m_data[2];
                  auVar50 = vfmadd231sd_fma(auVar50,auVar60,auVar60);
                  auVar50 = vsqrtsd_avx(auVar50,auVar50);
                  auVar57 = ZEXT1664(auVar50);
                }
                else {
                  this_06._vptr_ChGeometry = (_func_int **)extraout_RDX;
                  (*(extraout_RDX->super_ChTriangleMesh).super_ChGeometry._vptr_ChGeometry[2])
                            (extraout_RDX,(ulong)pVar24 & 0xffffffff,(ulong)pVar24 >> 0x20,this_05);
                }
                uVar15 = auStack_2a8._8_8_;
                if ((double)auStack_2a8._40_8_ < (double)auVar57._0_8_) {
                  pCStack_238 = (pointer)(ulong)(uint)vStack_260.
                                                                                                            
                                                  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)piVar39]._M_elems[lVar36 + 1];
                  auStack_2a8._28_4_ = (int)lVar36;
                  auStack_2a8._40_8_ = auVar57._0_8_;
                }
                bVar49 = lVar36 != 2;
                lVar36 = lVar36 + 1;
              } while (bVar49);
              if ((double)pCStack_240 <= (double)auStack_2a8._40_8_) {
                pCVar32 = (ChTriangleMeshConnected *)::operator_new(0x18);
                iVar23 = (int)pCStack_238;
                *(int *)&(pCVar32->m_vertices).
                         super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish = iVar23;
                std::__detail::_List_node_base::_M_hook((_List_node_base *)pCVar32);
                pCVar7 = (pointer)((long)(double *)auStack_2a8._16_8_ + 1);
                if ((pointer)0x3e8 < pCVar7) {
                  auStack_2a8._16_8_ = pCVar7;
                  this_04 = (ChException *)__cxa_allocate_exception(0x28);
                  sStack_1d8._M_dataplus._M_p = (pointer)&sStack_1d8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&sStack_1d8,
                             "overflow in ChTriangleMeshConnected::RefineMeshEdges","");
                  ChException::ChException(this_04,&sStack_1d8);
                  __cxa_throw(this_04,&ChException::typeinfo,ChException::~ChException);
                }
                if (iVar23 != -1) goto code_r0x0080b34f;
                if ((double)pCStack_240 < (double)auStack_2a8._40_8_) {
                  auStack_2a8._16_8_ = pCVar7;
                  SplitEdge((ChTriangleMeshConnected *)this_05,iVar38,-1,auStack_2a8._28_4_,0,
                            &iStack_2c4,&iStack_2c8,(int *)(auStack_2a8 + 0x24),
                            (int *)(auStack_2a8 + 0x20),&vStack_260,pvStack_208,
                            (vector<std::vector<int,_std::allocator<int>_>_*,_std::allocator<std::vector<int,_std::allocator<int>_>_*>_>
                             *)pStack_200,
                            (vector<std::vector<bool,_std::allocator<bool>_>_*,_std::allocator<std::vector<bool,_std::allocator<bool>_>_*>_>
                             *)CONCAT44(local_17c,local_180),
                            (vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
                             *)local_178.m_data[0]);
                  if (piVar39 < (pointer)((ulong)vStack_230.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_finish.
                                                 super__Bit_iterator_base._M_offset +
                                         ((long)vStack_230.
                                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                super__Bvector_impl_data._M_finish.
                                                super__Bit_iterator_base._M_p -
                                         (long)vStack_230.super__Bvector_base<std::allocator<bool>_>
                                               ._M_impl.super__Bvector_impl_data._M_start.
                                               super__Bit_iterator_base._M_p) * 8)) {
                    iVar23 = iVar38 + 0x3f;
                    if (-1 < iVar38) {
                      iVar23 = iVar38;
                    }
                    if ((*(ulong *)((int *)vStack_230.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_start.
                                           super__Bit_iterator_base._M_p +
                                   (long)(iVar23 >> 6) * 2 +
                                   (ulong)(((ulong)piVar39 & 0x800000000000003f) <
                                          0x8000000000000001) * 2 + -2) >> ((ulong)piVar39 & 0x3f) &
                        1) != 0) {
                      if (vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                  ((vector<int,std::allocator<int>> *)&vStack_2c0,
                                   (iterator)
                                   vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish,&iStack_2c4);
                      }
                      else {
                        *vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = iStack_2c4;
                        vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1;
                      }
                      if (vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish ==
                          vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage) {
                        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                  ((vector<int,std::allocator<int>> *)&vStack_2c0,
                                   (iterator)
                                   vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish,&iStack_2c8);
                      }
                      else {
                        *vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish = iStack_2c8;
                        vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish =
                             vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 1;
                      }
                    }
                  }
                  auStack_2a8._16_8_ = (long)((pointer)(auStack_2a8._16_8_ + -0x18))->m_data + 0x17;
                }
                goto LAB_0080b779;
              }
              auStack_2a8._16_8_ = (long)((pointer)(auStack_2a8._16_8_ + -0x18))->m_data + 0x17;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete((void *)uVar15,0x18);
            }
            pCVar32 = (ChTriangleMeshConnected *)auStack_2a8._0_8_;
            while (pCVar32 != (ChTriangleMeshConnected *)auStack_2a8) {
              pCVar10 = *(ChTriangleMeshConnected **)&pCVar32->super_ChTriangleMesh;
              operator_delete(pCVar32,0x18);
              pCVar32 = pCVar10;
            }
            plVar29 = *(list<int,std::allocator<int>> **)plStack_1e8;
          } while (*(list<int,std::allocator<int>> **)plStack_1e8 !=
                   (list<int,std::allocator<int>> *)&plStack_278);
        }
        pvVar33 = std::vector<int,_std::allocator<int>_>::operator=
                            ((vector<int,_std::allocator<int>_> *)pStack_1f0,&vStack_2c0);
        uVar22 = SUB81(pvVar33,0);
        if (vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
          uVar22 = extraout_AL;
        }
        if ((pointer)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (pointer)0x0
           ) {
          operator_delete(vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          uVar22 = extraout_AL_00;
        }
        if (vStack_260.
            super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_260.
                          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)vStack_260.
                                super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_260.
                                super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          uVar22 = extraout_AL_01;
        }
        while (plStack_278 != (list<int,std::allocator<int>> *)&plStack_278) {
          plVar29 = *(list<int,std::allocator<int>> **)plStack_278;
          operator_delete(plStack_278,0x18);
          uVar22 = extraout_AL_02;
          plStack_278 = plVar29;
        }
        return (bool)uVar22;
      }
      uVar40 = *(uint *)(lVar36 + (long)pVar46 * 4);
      __x = (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)(ulong)uVar40;
      local_178.m_data[0]._0_4_ = *(uint *)(lVar36 + (long)unaff_RBX * 4);
      if ((int)local_178.m_data[0]._0_4_ < (int)uVar40) {
        local_178.m_data[0]._0_4_ = uVar40;
      }
      if (__position_00._M_current == *(int **)(this_02 + 0x10)) {
        pcStack_190 = (code *)0x80afc3;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_02,__position_00,(int *)pVar24);
      }
      else {
        *__position_00._M_current = local_178.m_data[0]._0_4_;
        *(int **)(this_02 + 8) = __position_00._M_current + 1;
      }
      pVar44 = (pair<int,_int>)((long)pVar44 + 8);
      pvVar21 = (vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
                 *)local_178.m_data[0];
    } while (pVar44 != this_07);
  }
  puVar8 = *(undefined8 **)(aux_data_bool + 8);
  for (puVar45 = *(undefined8 **)aux_data_bool; puVar45 != puVar8; puVar45 = puVar45 + 1) {
    this_03 = (vector<bool,_std::allocator<bool>_> *)*puVar45;
    pcStack_190 = (code *)0x80afef;
    rVar62 = std::vector<bool,_std::allocator<bool>_>::at(this_03,(size_type)pVar46);
    bVar49 = true;
    if ((*rVar62._M_p & rVar62._M_mask) == 0) {
      pcStack_190 = (code *)0x80b001;
      rVar62 = std::vector<bool,_std::allocator<bool>_>::at(this_03,(size_type)unaff_RBX);
      bVar49 = (*rVar62._M_p & rVar62._M_mask) != 0;
    }
    pcStack_190 = (code *)0x80b012;
    std::vector<bool,_std::allocator<bool>_>::push_back(this_03,bVar49);
  }
  return true;
code_r0x0080b34f:
  uVar25 = (ulong)iVar23;
  auVar57 = ZEXT864(0);
  iVar38 = 0;
  uVar47 = 0;
  pCStack_1f8 = (pointer)0x0;
  uVar43 = 0;
  auStack_2a8._16_8_ = pCVar7;
  piStack_1e0 = piVar39;
  do {
    pVar24 = GetTriangleEdgeIndexes
                       (pCVar32,(((ChTriangleMeshConnected *)this_05)->m_face_v_indices).
                                super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar25,(int)uVar43,true)
    ;
    iVar23 = pVar24.first;
    if (extraout_RDX == (ChTriangleMeshConnected *)0x0) {
      pCVar7 = (((ChTriangleMeshConnected *)this_05)->m_vertices).
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar36 = (long)pVar24 >> 0x20;
      dVar12 = pCVar7[iVar23].m_data[1] - pCVar7[lVar36].m_data[1];
      auVar56._8_8_ = 0;
      auVar56._0_8_ = pCVar7[iVar23].m_data[0] - pCVar7[lVar36].m_data[0];
      auVar59._8_8_ = 0;
      auVar59._0_8_ = dVar12 * dVar12;
      auVar50 = vfmadd231sd_fma(auVar59,auVar56,auVar56);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = pCVar7[iVar23].m_data[2] - pCVar7[lVar36].m_data[2];
      auVar50 = vfmadd231sd_fma(auVar50,auVar61,auVar61);
      auVar50 = vsqrtsd_avx(auVar50,auVar50);
      auVar57 = ZEXT1664(auVar50);
    }
    else {
      pCVar32 = extraout_RDX;
      (*(extraout_RDX->super_ChTriangleMesh).super_ChGeometry._vptr_ChGeometry[2])
                (extraout_RDX,(ulong)pVar24 & 0xffffffff,(ulong)pVar24 >> 0x20,this_05);
    }
    piVar39 = piStack_1e0;
    if ((double)pCStack_1f8 < (double)auVar57._0_8_) {
      uVar47 = uVar43 & 0xffffffff;
      iVar38 = vStack_260.
               super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar25]._M_elems[uVar43 + 1];
      pCStack_1f8 = auVar57._0_8_;
    }
    bVar49 = uVar43 != 2;
    uVar43 = uVar43 + 1;
  } while (bVar49);
  iVar23 = (int)piStack_1e0;
  if (iVar38 == iVar23) {
    if ((double)pCStack_240 < (double)auStack_2a8._40_8_) {
      iVar38 = (int)pCStack_238;
      SplitEdge((ChTriangleMeshConnected *)this_05,iVar23,iVar38,auStack_2a8._28_4_,(int)uVar47,
                &iStack_2c4,&iStack_2c8,(int *)(auStack_2a8 + 0x24),(int *)(auStack_2a8 + 0x20),
                &vStack_260,pvStack_208,
                (vector<std::vector<int,_std::allocator<int>_>_*,_std::allocator<std::vector<int,_std::allocator<int>_>_*>_>
                 *)pStack_200,
                (vector<std::vector<bool,_std::allocator<bool>_>_*,_std::allocator<std::vector<bool,_std::allocator<bool>_>_*>_>
                 *)CONCAT44(local_17c,local_180),
                (vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
                 *)local_178.m_data[0]);
      if (piVar39 < (pointer)((ulong)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                     _M_offset +
                             ((long)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p
                             - (long)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             ) * 8)) {
        iVar35 = iVar23 + 0x3f;
        if (-1 < iVar23) {
          iVar35 = iVar23;
        }
        if ((*(ulong *)((int *)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       (long)(iVar35 >> 6) * 2 +
                       (ulong)(((ulong)piVar39 & 0x800000000000003f) < 0x8000000000000001) * 2 + -2)
             >> ((ulong)piVar39 & 0x3f) & 1) != 0) {
          if (vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&vStack_2c0,
                       (iterator)
                       vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&iStack_2c4);
          }
          else {
            *vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = iStack_2c4;
            vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish = vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          if (vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&vStack_2c0,
                       (iterator)
                       vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,&iStack_2c8);
          }
          else {
            *vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = iStack_2c8;
            vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish = vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      if (uVar25 < (ulong)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                   ((long)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                   (long)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
        iVar23 = iVar38 + 0x3f;
        if (-1 < iVar38) {
          iVar23 = iVar38;
        }
        if ((*(ulong *)((int *)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       (long)(iVar23 >> 6) * 2 +
                       (ulong)((uVar25 & 0x800000000000003f) < 0x8000000000000001) * 2 + -2) >>
             (uVar25 & 0x3f) & 1) != 0) {
          if (vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&vStack_2c0,
                       (iterator)
                       vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)(auStack_2a8 + 0x24));
          }
          else {
            *vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = auStack_2a8._36_4_;
            vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish = vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
          if (vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&vStack_2c0,
                       (iterator)
                       vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)(auStack_2a8 + 0x20));
          }
          else {
            *vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = auStack_2a8._32_4_;
            vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish = vStack_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
          }
        }
      }
    }
    auStack_2a8._16_8_ = (long)((pointer)(auStack_2a8._16_8_ + -0x18))->m_data + 0x17;
LAB_0080b779:
    uVar15 = auStack_2a8._8_8_;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete((void *)uVar15,0x18);
    uVar15 = auStack_2a8._8_8_;
    auStack_2a8._16_8_ = (long)((pointer)(auStack_2a8._16_8_ + -0x18))->m_data + 0x17;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete((void *)uVar15,0x18);
  }
  goto LAB_0080b1ef;
}

Assistant:

bool ChTriangleMeshConnected::SplitEdge(
    int itA,                                              // triangle index,
    int itB,                                              // triangle index, -1 if not existing (means free edge on A)
    int neA,                                              // n.edge on tri A: 0,1,2
    int neB,                                              // n.edge on tri B: 0,1,2
    int& itA_1,                                           // returns the index of split triangle A, part1
    int& itA_2,                                           // returns the index of split triangle A, part2
    int& itB_1,                                           // returns the index of split triangle B, part1
    int& itB_2,                                           // returns the index of split triangle B, part2
    std::vector<std::array<int, 4>>& tri_map,             // triangle neighboring map
    std::vector<std::vector<double>*>& aux_data_double,   // auxiliary buffers to interpolate
    std::vector<std::vector<int>*>& aux_data_int,         // auxiliary buffers to interpolate
    std::vector<std::vector<bool>*>& aux_data_bool,       // auxiliary buffers to interpolate
    std::vector<std::vector<ChVector<>>*>& aux_data_vect  // auxiliary buffers to interpolate
) {
    std::array<std::vector<ChVector<int>>*, 4> face_indexes{
        &m_face_v_indices,   //
        &m_face_n_indices,   //
        &m_face_uv_indices,  //
        &m_face_col_indices  //
    };

    int iea = 0;
    int ieb = 0;

    for (int ibuffer = 0; ibuffer < 4; ++ibuffer) {
        if (face_indexes[ibuffer]->size()) {
            // case where one used normals, uv, color buffers, with custom face indexes:
            std::pair<int, int> eA;
            eA = ChTriangleMeshConnected::GetTriangleEdgeIndexes(face_indexes[ibuffer]->at(itA), neA, false);
            std::pair<int, int> eAB = eA;
            std::pair<int, int> eB;
            if (itB != -1)
                eB = ChTriangleMeshConnected::GetTriangleEdgeIndexes(face_indexes[ibuffer]->at(itB), neB, false);
            bool swapA = false;
            if (eA.first > eA.second) {
                swapA = true;
                eAB = {eA.second, eA.first};
            }
            bool swapB = false;
            if (eB.first > eB.second)
                swapB = true;

            // average new vertex/property and add it
            int iVnew = -1;
            InterpolateAndInsert(*this, ibuffer, eAB.first, eAB.second, iVnew);

            if (ibuffer == 0) {
                iea = eAB.first;
                ieb = eAB.second;
            }

            itA_1 = -1;
            itA_2 = -1;
            itB_1 = -1;
            itB_2 = -1;

            // Split triangle A in two (reuse existing, and allocate one new)
            ChVector<int> tA_1 = face_indexes[ibuffer]->at(itA);
            if (tA_1.x() == eAB.first)
                tA_1.x() = iVnew;
            if (tA_1.y() == eAB.first)
                tA_1.y() = iVnew;
            if (tA_1.z() == eAB.first)
                tA_1.z() = iVnew;
            ChVector<int> tA_2 = face_indexes[ibuffer]->at(itA);
            if (tA_2.x() == eAB.second)
                tA_2.x() = iVnew;
            if (tA_2.y() == eAB.second)
                tA_2.y() = iVnew;
            if (tA_2.z() == eAB.second)
                tA_2.z() = iVnew;
            face_indexes[ibuffer]->at(itA) = tA_1;  // reuse face
            itA_1 = itA;
            face_indexes[ibuffer]->push_back(tA_2);  // allocate new face
            itA_2 = (int)face_indexes[ibuffer]->size() - 1;

            // Split triangle B in two (reuse existing, and allocate one new)
            if (itB != -1) {
                ChVector<int> tB_1 = face_indexes[ibuffer]->at(itB);
                if (tB_1.x() == eAB.first)
                    tB_1.x() = iVnew;
                if (tB_1.y() == eAB.first)
                    tB_1.y() = iVnew;
                if (tB_1.z() == eAB.first)
                    tB_1.z() = iVnew;
                ChVector<int> tB_2 = face_indexes[ibuffer]->at(itB);
                if (tB_2.x() == eAB.second)
                    tB_2.x() = iVnew;
                if (tB_2.y() == eAB.second)
                    tB_2.y() = iVnew;
                if (tB_2.z() == eAB.second)
                    tB_2.z() = iVnew;
                face_indexes[ibuffer]->at(itB) = tB_1;  // reuse face
                itB_1 = itB;
                face_indexes[ibuffer]->push_back(tB_2);  // allocate new face
                itB_2 = (int)face_indexes[ibuffer]->size() - 1;
            }

            // for m_face_v_indices buffer (vertex indexes) only:
            if (ibuffer == 0) {
                // Update triangle neighboring map

                std::array<int, 4> topo_A_1 = tri_map[itA];
                std::array<int, 4> topo_A_2 = tri_map[itA];
                topo_A_1[1 + neA] = itB_1;
                topo_A_2[1 + neA] = itB_2;
                int is1 = 1 + ((neA + 2) % 3);
                int is2 = 1 + ((neA + 1) % 3);
                if (swapA)
                    std::swap(is1, is2);
                topo_A_1[is1] = itA_2;
                topo_A_2[is2] = itA_1;
                int itD = topo_A_1[is2];
                int itC = topo_A_2[is1];
                for (int in = 1; in < 4; ++in)
                    if (tri_map[itD][in] == itA)
                        tri_map[itD][in] = itA_1;  // not needed?
                for (int in = 1; in < 4; ++in)
                    if (tri_map[itC][in] == itA)
                        tri_map[itC][in] = itA_2;
                tri_map[itA] = topo_A_1;      // reuse
                tri_map.push_back(topo_A_2);  // allocate
                topo_A_2[0] = (int)tri_map.size() - 1;

                if (itB != -1) {
                    std::array<int, 4> topo_B_1 = tri_map[itB];
                    std::array<int, 4> topo_B_2 = tri_map[itB];
                    topo_B_1[1 + neB] = itA_1;
                    topo_B_2[1 + neB] = itA_2;
                    is1 = 1 + ((neB + 2) % 3);
                    is2 = 1 + ((neB + 1) % 3);
                    if (swapB)
                        std::swap(is1, is2);
                    topo_B_1[is1] = itB_2;
                    topo_B_2[is2] = itB_1;
                    int itF = topo_B_1[is2];
                    int itE = topo_B_2[is1];
                    for (int in = 1; in < 4; ++in)
                        if (tri_map[itF][in] == itB)
                            tri_map[itF][in] = itB_1;  // not needed?
                    for (int in = 1; in < 4; ++in)
                        if (tri_map[itE][in] == itB)
                            tri_map[itE][in] = itB_2;
                    tri_map[itB] = topo_B_1;      // reuse
                    tri_map.push_back(topo_B_2);  // allocate
                    topo_B_2[0] = (int)tri_map.size() - 1;
                }
            }
        } else {
            // case of n or uv or color buffers without indexes, because assumed matching the vertex pos buffer:
            int iVnew = -1;
            InterpolateAndInsert(*this, ibuffer, iea, ieb, iVnew);
        }

    }  // end loop on buffers

    // just in case the user populated the vector of external auxiliary data buffers,
    // interpolate and store the created value. Assume those have same size of m_vertices
    for (auto data_buffer : aux_data_double) {
        double data = (data_buffer->at(iea) + data_buffer->at(ieb)) * 0.5;
        data_buffer->push_back(data);
    }
    for (auto data_buffer : aux_data_vect) {
        ChVector<> data = (data_buffer->at(iea) + data_buffer->at(ieb)) * 0.5;
        data_buffer->push_back(data);
    }
    for (auto data_buffer : aux_data_int) {
        int data = std::max(data_buffer->at(iea), data_buffer->at(ieb));
        data_buffer->push_back(data);
    }
    for (auto data_buffer : aux_data_bool) {
        bool data = data_buffer->at(iea) || data_buffer->at(ieb);
        data_buffer->push_back(data);
    }

    return true;
}